

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlDocPtr xmlSAXParseFileWithData(xmlSAXHandlerPtr sax,char *filename,int recovery,void *data)

{
  int iVar1;
  xmlParserInputBufferPtr pxVar2;
  xmlParserCtxtPtr ctxt;
  char *pcVar3;
  xmlDocPtr cur;
  
  xmlInitParser();
  ctxt = xmlCreateFileParserCtxt(filename);
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return (xmlDocPtr)0x0;
  }
  if (sax != (xmlSAXHandlerPtr)0x0) {
    if (ctxt->sax != (_xmlSAXHandler *)0x0) {
      (*xmlFree)(ctxt->sax);
    }
    ctxt->sax = sax;
  }
  xmlDetectSAX2(ctxt);
  if (data != (void *)0x0) {
    ctxt->_private = data;
  }
  if (ctxt->directory == (char *)0x0) {
    pcVar3 = xmlParserGetDirectory(filename);
    ctxt->directory = pcVar3;
  }
  ctxt->recovery = recovery;
  xmlParseDocument(ctxt);
  cur = ctxt->myDoc;
  if (recovery == 0 && ctxt->wellFormed == 0) {
    xmlFreeDoc(cur);
    ctxt->myDoc = (xmlDocPtr)0x0;
  }
  else if (cur != (xmlDocPtr)0x0) {
    pxVar2 = ctxt->input->buf;
    if (pxVar2 != (xmlParserInputBufferPtr)0x0) {
      iVar1 = pxVar2->compressed;
      if (iVar1 < 1) {
        cur->compression = iVar1;
      }
      else {
        cur->compression = 9;
      }
    }
    goto LAB_001638e9;
  }
  cur = (xmlDocPtr)0x0;
LAB_001638e9:
  if (sax != (xmlSAXHandlerPtr)0x0) {
    ctxt->sax = (_xmlSAXHandler *)0x0;
  }
  xmlFreeParserCtxt(ctxt);
  return cur;
}

Assistant:

xmlDocPtr
xmlSAXParseFileWithData(xmlSAXHandlerPtr sax, const char *filename,
                        int recovery, void *data) {
    xmlDocPtr ret;
    xmlParserCtxtPtr ctxt;

    xmlInitParser();

    ctxt = xmlCreateFileParserCtxt(filename);
    if (ctxt == NULL) {
	return(NULL);
    }
    if (sax != NULL) {
	if (ctxt->sax != NULL)
	    xmlFree(ctxt->sax);
        ctxt->sax = sax;
    }
    xmlDetectSAX2(ctxt);
    if (data!=NULL) {
	ctxt->_private = data;
    }

    if (ctxt->directory == NULL)
        ctxt->directory = xmlParserGetDirectory(filename);

    ctxt->recovery = recovery;

    xmlParseDocument(ctxt);

    if ((ctxt->wellFormed) || recovery) {
        ret = ctxt->myDoc;
	if ((ret != NULL) && (ctxt->input->buf != NULL)) {
	    if (ctxt->input->buf->compressed > 0)
		ret->compression = 9;
	    else
		ret->compression = ctxt->input->buf->compressed;
	}
    }
    else {
       ret = NULL;
       xmlFreeDoc(ctxt->myDoc);
       ctxt->myDoc = NULL;
    }
    if (sax != NULL)
        ctxt->sax = NULL;
    xmlFreeParserCtxt(ctxt);

    return(ret);
}